

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void chrono::Transform_Cq_to_Cqw
               (ChConstraintMatrixX7 *mCq,ChConstraintMatrixX6 *mCqw,ChBodyFrame *mbody)

{
  long lVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  Index row;
  long lVar5;
  undefined8 *puVar6;
  int col_1;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  Index inner;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 local_a0;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  
  puVar6 = &local_a0;
  lVar1 = (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.m_rows;
  if (lVar1 < 0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 7, 1, 7, 7>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 7, 1, 7, 7>>, Level = 0]"
                 );
  }
  if (lVar1 <= (mCqw->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>).m_storage.
               m_rows) {
    if (lVar1 != 0) {
      lVar5 = 0;
      pdVar8 = (double *)mCqw;
      pdVar9 = (double *)mCq;
      do {
        lVar10 = 0;
        do {
          pdVar8[lVar10] = pdVar9[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        lVar5 = lVar5 + 1;
        pdVar9 = pdVar9 + 7;
        pdVar8 = pdVar8 + 6;
      } while (lVar5 != lVar1);
    }
    dVar3 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
    dVar4 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    auVar12._0_8_ = dVar3 + dVar3;
    auVar12._8_8_ = dVar4 + dVar4;
    local_80._0_8_ = -auVar12._0_8_;
    local_80._8_8_ = -auVar12._8_8_;
    local_88 = vmovlpd_avx(local_80);
    dVar3 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
    dVar4 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
    lVar5 = 1;
    if (1 < lVar1) {
      lVar5 = lVar1;
    }
    lVar10 = 0;
    local_70._0_8_ = dVar3 + dVar3;
    local_70._8_8_ = dVar4 + dVar4;
    auVar2 = vshufpd_avx(local_70,local_70,1);
    local_60 = vshufpd_avx(local_80,auVar12,1);
    auVar13._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
    auVar13._8_8_ = auVar2._8_8_ ^ 0x8000000000000000;
    local_a0 = vmovlpd_avx(auVar13);
    local_98 = local_70._0_8_;
    dStack_90 = auVar12._8_8_;
    local_50 = vunpcklpd_avx(auVar13,local_70);
    do {
      if (lVar1 != 0) {
        pdVar8 = (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.
                 m_data.array + 3;
        lVar11 = 0;
        do {
          auVar12 = ZEXT816(0) << 0x40;
          lVar7 = 0;
          do {
            auVar14._8_8_ = 0;
            auVar14._0_8_ = pdVar8[lVar7];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)((long)puVar6 + lVar7 * 8);
            auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar2);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          lVar7 = lVar11 + 1;
          pdVar8 = pdVar8 + 7;
          (mCqw->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>).m_storage.m_data.
          array[lVar10 + lVar11 * 6 + 3] = auVar12._0_8_ * 0.25;
          lVar11 = lVar7;
        } while (lVar7 != lVar5);
      }
      lVar10 = lVar10 + 1;
      puVar6 = (undefined8 *)((long)puVar6 + 0x20);
    } while (lVar10 != 3);
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 6, 1, 7, 6>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 6, 1, 7, 6>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

static void Transform_Cq_to_Cqw(const ChLinkLock::ChConstraintMatrixX7& mCq,
                                ChLinkLock::ChConstraintMatrixX6& mCqw,
                                ChBodyFrame* mbody) {
    // translational part - not changed
    mCqw.block(0, 0, mCq.rows(), 3) = mCq.block(0, 0, mCq.rows(), 3);

    // rotational part [Cq_w] = [Cq_q]*[Gl]'*1/4
    ChGlMatrix34<> mGl(mbody->GetCoord().rot);
    for (int colres = 0; colres < 3; colres++) {
        for (int row = 0; row < mCq.rows(); row++) {
            double sum = 0;
            for (int col = 0; col < 4; col++) {
                sum += mCq(row, col + 3) * mGl(colres, col);
            }
            mCqw(row, colres + 3) = sum * 0.25;
        }
    }
    //// RADU: explicit loop slightly more performant than Eigen expressions
    ////mCqw.block(0, 3, mCq.rows(), 3) = 0.25 * mCq.block(0, 3, mCq.rows(), 4) * mGl.transpose();
}